

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllTypes.cpp
# Opt level: O2

void __thiscall
slang::ast::EnumType::EnumType
          (EnumType *this,Compilation *compilation,SourceLocation loc,Type *baseType_,
          ASTContext *context)

{
  int iVar1;
  SymbolIndex SVar2;
  bool bVar3;
  bool bVar4;
  bitwidth_t bVar5;
  
  bVar5 = Type::getBitWidth(baseType_);
  bVar3 = Type::isSigned(baseType_);
  bVar4 = Type::isFourState(baseType_);
  (this->super_IntegralType).super_Type.super_Symbol.kind = EnumType;
  (this->super_IntegralType).super_Type.super_Symbol.name._M_len = 0;
  (this->super_IntegralType).super_Type.super_Symbol.name._M_str = "";
  (this->super_IntegralType).super_Type.super_Symbol.location = loc;
  (this->super_IntegralType).super_Type.super_Symbol.originatingSyntax = (SyntaxNode *)0x0;
  (this->super_IntegralType).super_Type.super_Symbol.parentScope = (Scope *)0x0;
  (this->super_IntegralType).super_Type.super_Symbol.nextInScope = (Symbol *)0x0;
  (this->super_IntegralType).super_Type.super_Symbol.indexInScope = 0;
  (this->super_IntegralType).super_Type.canonical = (Type *)this;
  (this->super_IntegralType).bitWidth = bVar5;
  (this->super_IntegralType).isSigned = bVar3;
  (this->super_IntegralType).isFourState = bVar4;
  Scope::Scope(&this->super_Scope,compilation,(Symbol *)this);
  this->baseType = baseType_;
  iVar1 = compilation->nextEnumSystemId;
  compilation->nextEnumSystemId = iVar1 + 1;
  this->systemId = iVar1;
  SVar2 = context->lookupIndex;
  (this->super_IntegralType).super_Type.super_Symbol.parentScope = (context->scope).ptr;
  (this->super_IntegralType).super_Type.super_Symbol.indexInScope = SVar2;
  return;
}

Assistant:

EnumType::EnumType(Compilation& compilation, SourceLocation loc, const Type& baseType_,
                   const ASTContext& context) :
    IntegralType(SymbolKind::EnumType, "", loc, baseType_.getBitWidth(), baseType_.isSigned(),
                 baseType_.isFourState()),
    Scope(compilation, this), baseType(baseType_), systemId(compilation.getNextEnumSystemId()) {

    // Enum types don't live as members of the parent scope (they're "owned" by the declaration
    // containing them) but we hook up the parent pointer so that it can participate in name
    // lookups.
    setParent(*context.scope, context.lookupIndex);
}